

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O3

Harris * __thiscall Harris::GaussFilter(Harris *this,Mat *img,int range)

{
  int in_ECX;
  int iVar1;
  undefined4 in_register_00000014;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  float fVar9;
  Mat *gauss;
  Mat gaussHelperV;
  Mat local_90 [16];
  long local_80;
  long *local_48;
  
  lVar2 = CONCAT44(in_register_00000014,range);
  cv::Mat::Mat(local_90,*(int *)(lVar2 + 8) + in_ECX * -2,*(int *)(lVar2 + 0xc) + in_ECX * -2,5);
  iVar3 = *(int *)(lVar2 + 8);
  iVar1 = *(int *)(lVar2 + 0xc);
  if (in_ECX < iVar3 - in_ECX) {
    lVar5 = (long)in_ECX;
    lVar6 = lVar5;
    do {
      if (in_ECX < iVar1 - in_ECX) {
        lVar4 = lVar5;
        do {
          fVar9 = 0.0;
          iVar3 = in_ECX * 2 + 1;
          iVar7 = -in_ECX;
          if (-1 < in_ECX) {
            do {
              dVar8 = exp((double)iVar7 * -0.5 * (double)iVar7);
              fVar9 = fVar9 + (float)(dVar8 * 0.3989422804014327) *
                              *(float *)(**(long **)(lVar2 + 0x48) * (lVar6 - lVar5) +
                                         *(long *)(lVar2 + 0x10) + (lVar4 - lVar5) * 4);
              iVar3 = iVar3 + -1;
              iVar7 = iVar7 + 1;
            } while (iVar3 != 0);
            iVar1 = *(int *)(lVar2 + 0xc);
          }
          *(float *)(*local_48 * (lVar6 - lVar5) + local_80 + (lVar4 - lVar5) * 4) = fVar9;
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar1 - in_ECX);
        iVar3 = *(int *)(lVar2 + 8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3 - in_ECX);
  }
  cv::Mat::Mat(&this->harrisResponses,iVar3 + in_ECX * -2,iVar1 + in_ECX * -2,5);
  iVar3 = *(int *)(lVar2 + 8);
  if (in_ECX < iVar3 - in_ECX) {
    lVar5 = (long)in_ECX;
    iVar1 = *(int *)(lVar2 + 0xc);
    lVar6 = lVar5;
    do {
      if (in_ECX < iVar1 - in_ECX) {
        lVar4 = lVar5;
        do {
          fVar9 = 0.0;
          iVar3 = in_ECX * 2 + 1;
          iVar7 = -in_ECX;
          if (-1 < in_ECX) {
            do {
              dVar8 = exp((double)iVar7 * -0.5 * (double)iVar7);
              fVar9 = fVar9 + (float)(dVar8 * 0.3989422804014327) *
                              *(float *)(*local_48 * (lVar6 - lVar5) + local_80 +
                                        (lVar4 - lVar5) * 4);
              iVar3 = iVar3 + -1;
              iVar7 = iVar7 + 1;
            } while (iVar3 != 0);
            iVar1 = *(int *)(lVar2 + 0xc);
          }
          *(float *)(**(long **)&this->field_0x48 * (lVar6 - lVar5) + *(long *)&this->field_0x10 +
                    (lVar4 - lVar5) * 4) = fVar9;
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar1 - in_ECX);
        iVar3 = *(int *)(lVar2 + 8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3 - in_ECX);
  }
  cv::Mat::~Mat(local_90);
  return this;
}

Assistant:

Mat Harris::GaussFilter(Mat& img, int range) {
    // Helper Mats for better time complexity
    Mat gaussHelperV(img.rows-range*2, img.cols-range*2, CV_32F);
    for(int r=range; r<img.rows-range; r++) {
        for(int c=range; c<img.cols-range; c++) {
            float res = 0;

            for(int x = -range; x<=range; x++) {
                float m = 1/sqrt(2*M_PI)*exp(-0.5*x*x);

                res += m * img.at<float>(r-range,c-range);
            }

            gaussHelperV.at<float>(r-range,c-range) = res;
        }
    }

    Mat gauss(img.rows-range*2, img.cols-range*2, CV_32F);
    for(int r=range; r<img.rows-range; r++) {
        for(int c=range; c<img.cols-range; c++) {
            float res = 0;

            for(int x = -range; x<=range; x++) {
                float m = 1/sqrt(2*M_PI)*exp(-0.5*x*x);

                res += m * gaussHelperV.at<float>(r-range,c-range);
            }

            gauss.at<float>(r-range,c-range) = res;
        }
    }

    return gauss;
}